

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::preprocessingStringAfterQuote(CScanner *this,char c)

{
  if (c == '\'') {
    std::__cxx11::string::push_back((char)this + -0x50);
    this->preprocessingState = PS_String;
    return;
  }
  if ((this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
      word._M_string_length != 0) {
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_String;
    CParser::AddToken(&this->super_CParser);
    this->preprocessingState = PS_Initial;
    preprocessing(this,c);
    return;
  }
  __assert_fail("!token.word.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                ,0x1a1,"void Refal2::CScanner::preprocessingStringAfterQuote(char)");
}

Assistant:

void CScanner::preprocessingStringAfterQuote( char c )
{
	if( c == Quote ) {
		token.word.push_back( Quote );
		preprocessingState = PS_String;
	} else {
		assert( !token.word.empty() );
		addToken( TT_String );
		preprocessingState = PS_Initial;
		preprocessing( c );
	}
}